

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeInternalForces_impl
          (ChElementBeamIGA *this,ChVectorDynamic<> *Fi,ChState *state_x,ChStateDelta *state_w,
          bool used_for_differentiation)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  element_type *peVar13;
  element_type *peVar14;
  double *pdVar15;
  pointer psVar16;
  pointer psVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  ChVectorDynamic<> *pCVar26;
  int iVar27;
  long lVar28;
  ChQuadratureTables *pCVar29;
  undefined8 *puVar30;
  long lVar31;
  ulong uVar32;
  pointer pCVar33;
  ChVector<double> *pCVar34;
  ulong uVar35;
  ulong uVar36;
  double *pdVar37;
  undefined7 in_register_00000081;
  double *pdVar38;
  Index index_3;
  Index index_2;
  ActualDstType actualDst;
  double dVar39;
  ChVectorDynamic<> *pCVar40;
  long lVar41;
  long lVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 extraout_var [56];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  double dVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  double dVar206;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  ChMatrixDynamic<> N;
  ChVector<double> r_i;
  ChVector<double> astrain_e;
  ChQuaternion<double> q_i;
  ChMatrix33<double> R;
  ChQuaternion<double> qR;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  ChVector<double> astrain_k;
  ChVector<double> astrain_e_dt;
  ChVector<double> Force_i;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  foo_plastic_data;
  ChVector<double> astrain_k_dt;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  undefined1 local_2a8 [16];
  long local_298;
  undefined1 local_288 [16];
  double local_278;
  double local_270 [3];
  ChQuaternion<double> local_258;
  ChVector<double> local_238;
  ChQuaternion<double> local_218;
  long local_1f8;
  long local_1e8;
  double *local_1e0;
  double local_1d8;
  ulong local_1d0;
  ChStateDelta *local_1c8;
  double local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  double local_1a8;
  ulong local_1a0;
  double local_198;
  undefined4 local_18c;
  ChQuaternion<double> local_188;
  ChVector<double> local_168;
  ChVector<double> local_148;
  double local_130;
  ChStateDelta *local_128;
  long local_120;
  double local_118;
  double local_110;
  ChVector<double> local_108;
  ChVectorDynamic<> *local_f0;
  ChVectorDynamic<> *local_e8;
  double local_e0;
  double local_d8;
  ChVector<double> local_d0;
  double local_b8 [4];
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  local_98;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar45 = in_ZMM16._0_16_;
  local_18c = (undefined4)CONCAT71(in_register_00000081,used_for_differentiation);
  lVar28 = (long)this->order;
  local_128 = state_w;
  if ((((lVar28 < 0) ||
       (lVar41 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows, lVar41 <= lVar28)) ||
      (lVar31 = ~this->order + lVar41, lVar31 < 0)) || (lVar41 <= lVar31)) {
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  pCVar40 = &this->knots;
  lVar41 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar41 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pdVar37 = (pCVar40->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  dVar39 = pdVar37[lVar28];
  dVar55 = pdVar37[lVar31];
  if (lVar41 != 0) {
    memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar41 << 3);
  }
  local_130 = (dVar55 - dVar39) * 0.5;
  local_e0 = (dVar39 + dVar55) * 0.5;
  local_f0 = pCVar40;
  local_e8 = Fi;
  if (0 < this->int_order_b) {
    lVar28 = 0;
    do {
      pCVar40 = local_f0;
      pCVar29 = ChQuadrature::GetStaticTables();
      auVar47._8_8_ = 0;
      auVar47._0_8_ =
           *(ulong *)(*(long *)&(pCVar29->Lroots).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [(long)this->int_order_b + -1].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data + lVar28 * 8);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_e0;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_130;
      auVar45 = vfmadd132sd_fma(auVar47,auVar46,auVar45);
      pCVar29 = ChQuadrature::GetStaticTables();
      uVar1 = *(undefined8 *)
               (*(long *)&(pCVar29->Weight).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)this->int_order_b + -1].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar28 * 8);
      local_d8 = (this->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28];
      iVar8 = this->order;
      local_2a8 = ZEXT816(0) << 0x20;
      local_298 = 0;
      iVar27 = (int)((ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      uVar32 = (ulong)iVar27;
      local_120 = lVar28;
      if ((long)uVar32 < 0) goto LAB_006a19a0;
      uStack_40 = 0;
      local_48 = uVar1;
      if (uVar32 >> 0x3e != 0 && iVar27 != 0) {
        puVar30 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar30 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar30,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)local_2a8,uVar32 * 2,2,uVar32);
      geometry::ChBasisToolsBspline::BasisEvaluateDeriv
                (this->order,iVar8,auVar45._0_8_,pCVar40,(ChMatrixDynamic<> *)local_2a8);
      local_2d0 = VNULL;
      local_2e0 = DAT_00b90ac0;
      local_2f0 = DAT_00b90ac8;
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar28 = 0x18;
        dVar39 = 1.48219693752374e-323;
        uVar32 = 0;
        do {
          local_1e0 = (double *)
                      ((long)(state_x->super_ChVectorDynamic<double>).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data + lVar28);
          local_1b0 = (state_x->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_1d8 = 1.97626258336499e-323;
          local_1c8 = (ChStateDelta *)state_x;
          local_1c0 = dVar39;
          if ((long)(local_1b0 - 4) < (long)dVar39) goto LAB_006a1981;
          ChQuaternion<double>::
          ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&local_218,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_1e0,(type *)0x0);
          dVar25 = local_218.m_data[3];
          dVar44 = local_218.m_data[0];
          peVar9 = (((this->nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = *(double *)&peVar9->field_0x38;
          dVar55 = *(double *)&peVar9->field_0x40;
          auVar240._8_8_ = 0;
          auVar240._0_8_ = dVar55;
          dVar53 = *(double *)&peVar9->field_0x48;
          auVar196._8_8_ = 0;
          auVar196._0_8_ = dVar53;
          dVar54 = *(double *)&peVar9->field_0x50;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = dVar54;
          auVar249._8_8_ = 0;
          auVar249._0_8_ = local_218.m_data[1];
          auVar233._8_8_ = 0;
          auVar233._0_8_ = local_218.m_data[2];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = local_218.m_data[3];
          auVar159._8_8_ = 0;
          auVar159._0_8_ = local_218.m_data[0] * dVar55;
          auVar45 = vfmsub231sd_fma(auVar159,auVar51,auVar249);
          auVar45 = vfmadd231sd_fma(auVar45,auVar50,auVar233);
          auVar47 = vfnmadd231sd_fma(auVar45,auVar196,auVar49);
          auVar215._8_8_ = 0;
          auVar215._0_8_ = local_218.m_data[0] * dVar53;
          auVar45 = vfmsub231sd_fma(auVar215,auVar51,auVar233);
          auVar45 = vfnmadd231sd_fma(auVar45,auVar50,auVar249);
          auVar45 = vfmadd231sd_fma(auVar45,auVar240,auVar49);
          auVar255._8_8_ = 0;
          auVar255._0_8_ = local_218.m_data[0] * dVar54;
          auVar46 = vfmsub231sd_fma(auVar255,auVar51,auVar49);
          auVar46 = vfmadd231sd_fma(auVar46,auVar196,auVar249);
          auVar46 = vfnmadd231sd_fma(auVar46,auVar240,auVar233);
          dVar56 = auVar45._0_8_;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = dVar56 * dVar56;
          auVar45 = vfmadd231sd_fma(auVar48,auVar47,auVar47);
          auVar45 = vfmadd231sd_fma(auVar45,auVar46,auVar46);
          dVar206 = 0.0;
          dVar52 = auVar45._0_8_;
          dVar147 = 0.0;
          dVar57 = 0.0;
          dVar43 = 1.0;
          if (0.0 < dVar52) {
            local_288._0_8_ = auVar47._0_8_;
            if (dVar52 < 0.0) {
              local_270[1] = local_218.m_data[2];
              local_198 = local_218.m_data[1];
              local_278 = dVar53;
              local_270[0] = *(double *)&peVar9->field_0x38;
              local_270[2] = dVar55;
              dVar53 = sqrt(dVar52);
              auVar233._8_8_ = 0;
              auVar233._0_8_ = local_270[1];
              auVar196._8_8_ = 0;
              auVar196._0_8_ = local_278;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = local_270[0];
              dVar55 = local_270[2];
              dVar206 = local_198;
            }
            else {
              auVar45 = vsqrtsd_avx(auVar45,auVar45);
              dVar53 = auVar45._0_8_;
              dVar206 = local_218.m_data[1];
            }
            auVar173._8_8_ = 0;
            auVar173._0_8_ = dVar54;
            auVar83._8_8_ = 0;
            auVar83._0_8_ = dVar25;
            auVar225._8_8_ = 0;
            auVar225._0_8_ = dVar44;
            auVar116._8_8_ = 0;
            auVar116._0_8_ = dVar55 * dVar206;
            auVar45 = vfmadd213sd_fma(auVar225,auVar51,auVar116);
            auVar45 = vfmadd213sd_fma(auVar233,auVar196,auVar45);
            auVar45 = vfmadd213sd_fma(auVar83,auVar173,auVar45);
            dVar206 = atan2(dVar53,auVar45._0_8_);
            dVar53 = 1.0 / dVar53;
            dVar55 = dVar53 * (double)local_288._0_8_;
            dVar56 = dVar53 * dVar56;
            dVar53 = dVar53 * auVar46._0_8_;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = dVar56 * dVar56;
            auVar84._8_8_ = 0;
            auVar84._0_8_ = dVar55;
            auVar45 = vfmadd231sd_fma(auVar58,auVar84,auVar84);
            auVar174._8_8_ = 0;
            auVar174._0_8_ = dVar53;
            auVar45 = vfmadd231sd_fma(auVar45,auVar174,auVar174);
            if (auVar45._0_8_ < 0.0) {
              local_288._0_8_ = dVar55;
              dVar54 = sqrt(auVar45._0_8_);
              dVar55 = (double)local_288._0_8_;
            }
            else {
              auVar45 = vsqrtsd_avx(auVar45,auVar45);
              dVar54 = auVar45._0_8_;
            }
            dVar206 = dVar206 + dVar206;
            bVar21 = 2.2250738585072014e-308 <= dVar54;
            dVar54 = 1.0 / dVar54;
            dVar57 = (double)((ulong)bVar21 * (long)(dVar56 * dVar54));
            dVar43 = (double)((ulong)bVar21 * (long)(dVar55 * dVar54) +
                             (ulong)!bVar21 * 0x3ff0000000000000);
            dVar147 = (double)((ulong)bVar21 * (long)(dVar53 * dVar54));
          }
          if (dVar206 <= 3.141592653589793) {
            if (dVar206 < -3.141592653589793) {
              dVar206 = dVar206 + 6.283185307179586;
            }
          }
          else {
            dVar206 = dVar206 + -6.283185307179586;
          }
          if (((long)local_2a8._8_8_ < 1) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
          dVar55 = *(double *)(local_2a8._0_8_ + uVar32 * 8);
          local_2d0 = local_2d0 + dVar206 * dVar43 * dVar55;
          local_2e0 = local_2e0 + dVar206 * dVar57 * dVar55;
          local_2f0 = local_2f0 + dVar206 * dVar147 * dVar55;
          uVar32 = uVar32 + 1;
          lVar28 = lVar28 + 0x38;
          dVar39 = (double)((long)dVar39 + 7);
        } while (uVar32 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      auVar129._8_8_ = 0;
      auVar129._0_8_ = local_2d0;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_2e0 * local_2e0;
      auVar45 = vfmadd231sd_fma(auVar85,auVar129,auVar129);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_2f0;
      auVar45 = vfmadd231sd_fma(auVar45,auVar59,auVar59);
      dVar55 = auVar45._0_8_;
      dVar39 = 0.5;
      auVar46 = ZEXT816(0x3ff0000000000000);
      if (1e-30 < dVar55) {
        if (dVar55 < 0.0) {
          dVar55 = sqrt(dVar55);
        }
        else {
          auVar45 = vsqrtsd_avx(auVar45,auVar45);
          dVar55 = auVar45._0_8_;
        }
        local_288._0_8_ = dVar55 * 0.5;
        dVar39 = sin(dVar55 * 0.5);
        dVar39 = dVar39 / dVar55;
        auVar262._0_8_ = cos((double)local_288._0_8_);
        auVar262._8_56_ = extraout_var;
        auVar46 = auVar262._0_16_;
      }
      peVar9 = (((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = *(ulong *)&peVar9->field_0x38;
      dVar55 = *(double *)&peVar9->field_0x40;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = dVar55;
      auVar175._8_8_ = 0;
      auVar175._0_8_ = local_2d0 * dVar39 * dVar55;
      auVar45 = vfmsub231sd_fma(auVar175,auVar148,auVar46);
      auVar187._8_8_ = 0;
      auVar187._0_8_ = *(double *)&peVar9->field_0x48;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_2e0 * dVar39;
      auVar45 = vfnmadd231sd_fma(auVar45,auVar187,auVar117);
      auVar197._8_8_ = 0;
      auVar197._0_8_ = *(double *)&peVar9->field_0x50;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = dVar39 * local_2f0;
      auVar47 = vfnmadd231sd_fma(auVar45,auVar197,auVar130);
      dVar53 = auVar46._0_8_;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_2d0 * dVar39;
      auVar207._8_8_ = 0;
      auVar207._0_8_ = dVar53 * dVar55;
      auVar45 = vfmadd231sd_fma(auVar207,auVar148,auVar86);
      auVar45 = vfnmadd231sd_fma(auVar45,auVar197,auVar117);
      auVar45 = vfmadd231sd_fma(auVar45,auVar187,auVar130);
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_2e0 * dVar39;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = dVar53 * *(double *)&peVar9->field_0x48;
      auVar46 = vfmadd231sd_fma(auVar216,auVar148,auVar118);
      auVar46 = vfmadd231sd_fma(auVar46,auVar197,auVar86);
      auVar131._8_8_ = 0;
      auVar131._0_8_ = dVar39 * local_2f0;
      auVar48 = vfnmadd231sd_fma(auVar46,auVar160,auVar131);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(double *)&peVar9->field_0x50 * dVar53;
      auVar46 = vfmadd231sd_fma(auVar60,auVar148,auVar131);
      auVar46 = vfnmadd231sd_fma(auVar46,auVar187,auVar86);
      auVar46 = vfmadd231sd_fma(auVar46,auVar160,auVar118);
      local_188.m_data[0] = auVar47._0_8_;
      local_188.m_data[1] = auVar45._0_8_;
      local_188.m_data[2] = auVar48._0_8_;
      local_188.m_data[3] = auVar46._0_8_;
      ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_1e0,&local_188);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_288._8_8_;
      local_288 = auVar23 << 0x40;
      local_2e0 = 0.0;
      local_2d0 = 0.0;
      local_2f0 = 0.0;
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_2f0 = 0.0;
        lVar28 = 0;
        lVar41 = 0;
        uVar32 = 0;
        local_2d0 = 0.0;
        local_2e0 = 0.0;
        do {
          local_218.m_data[0] =
               (double)((long)(state_x->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + lVar41);
          local_1e8 = (state_x->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_218.m_data[1] = 1.48219693752374e-323;
          local_218.m_data[3] = (double)state_x;
          local_1f8 = lVar28;
          if (local_1e8 + -3 < lVar28) goto LAB_006a1981;
          ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    ((ChVector<double> *)&local_258,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_218,(type *)0x0);
          if (((long)local_2a8._8_8_ < 2) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
          dVar39 = *(double *)(local_2a8._0_8_ + (local_298 + uVar32) * 8);
          local_2f0 = local_2f0 + dVar39 * local_258.m_data[0];
          local_2d0 = local_2d0 + dVar39 * local_258.m_data[1];
          local_2e0 = local_2e0 + dVar39 * local_258.m_data[2];
          uVar32 = uVar32 + 1;
          lVar41 = lVar41 + 0x38;
          lVar28 = lVar28 + 7;
        } while (uVar32 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      local_2b0 = 0.0;
      local_2e8 = 0.0;
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_2e8 = 0.0;
        lVar28 = 0;
        lVar41 = 0;
        uVar32 = 0;
        local_2b0 = 0.0;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_288._8_8_;
        local_288 = auVar24 << 0x40;
        do {
          local_218.m_data[0] =
               (double)((long)(local_128->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + lVar41);
          local_1e8 = (local_128->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_218.m_data[1] = 1.48219693752374e-323;
          local_218.m_data[3] = (double)local_128;
          local_1f8 = lVar28;
          if (local_1e8 + -3 < lVar28) goto LAB_006a1981;
          ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    ((ChVector<double> *)&local_258,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_218,(type *)0x0);
          if (((long)local_2a8._8_8_ < 2) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
          dVar39 = *(double *)(local_2a8._0_8_ + (local_298 + uVar32) * 8);
          local_2e8 = local_2e8 + dVar39 * local_258.m_data[0];
          local_2b0 = local_2b0 + dVar39 * local_258.m_data[1];
          local_288._0_8_ = (double)local_288._0_8_ + dVar39 * local_258.m_data[2];
          uVar32 = uVar32 + 1;
          lVar41 = lVar41 + 0x30;
          lVar28 = lVar28 + 6;
        } while (uVar32 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      local_278 = VNULL;
      local_270[0] = DAT_00b90ac0;
      local_2d8 = DAT_00b90ac8;
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar41 = 0x18;
        lVar28 = 3;
        uVar32 = 0;
        do {
          local_218.m_data[0] =
               (double)((long)(state_x->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + lVar41);
          local_1e8 = (state_x->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_218.m_data[1] = 1.97626258336499e-323;
          local_218.m_data[3] = (double)state_x;
          local_1f8 = lVar28;
          if (local_1e8 + -4 < lVar28) goto LAB_006a1981;
          ChQuaternion<double>::
          ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&local_258,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_218,(type *)0x0);
          auVar188._8_8_ = 0;
          auVar188._0_8_ = local_188.m_data[0];
          auVar241._8_8_ = 0;
          auVar241._0_8_ = local_188.m_data[1];
          auVar198._8_8_ = 0;
          auVar198._0_8_ = local_188.m_data[2];
          auVar176._8_8_ = 0;
          auVar176._0_8_ = local_188.m_data[3];
          auVar250._8_8_ = 0;
          auVar250._0_8_ = local_258.m_data[1];
          auVar234._8_8_ = 0;
          auVar234._0_8_ = local_258.m_data[2];
          auVar87._8_8_ = 0;
          auVar87._0_8_ = local_258.m_data[3];
          auVar161._8_8_ = 0;
          auVar161._0_8_ = local_258.m_data[0] * local_188.m_data[1];
          auVar45 = vfmsub231sd_fma(auVar161,auVar188,auVar250);
          auVar45 = vfmadd231sd_fma(auVar45,auVar176,auVar234);
          auVar47 = vfnmadd231sd_fma(auVar45,auVar198,auVar87);
          auVar217._8_8_ = 0;
          auVar217._0_8_ = local_258.m_data[0] * local_188.m_data[2];
          auVar45 = vfmsub231sd_fma(auVar217,auVar188,auVar234);
          auVar45 = vfnmadd231sd_fma(auVar45,auVar176,auVar250);
          auVar45 = vfmadd231sd_fma(auVar45,auVar241,auVar87);
          auVar256._8_8_ = 0;
          auVar256._0_8_ = local_258.m_data[0] * local_188.m_data[3];
          auVar46 = vfmsub231sd_fma(auVar256,auVar188,auVar87);
          auVar46 = vfmadd231sd_fma(auVar46,auVar198,auVar250);
          auVar46 = vfnmadd231sd_fma(auVar46,auVar241,auVar234);
          dVar55 = auVar45._0_8_;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = dVar55 * dVar55;
          auVar45 = vfmadd231sd_fma(auVar61,auVar47,auVar47);
          auVar45 = vfmadd231sd_fma(auVar45,auVar46,auVar46);
          dVar39 = 0.0;
          dVar56 = auVar45._0_8_;
          dVar54 = 0.0;
          dVar53 = 0.0;
          dVar206 = 1.0;
          if (0.0 < dVar56) {
            local_270[1] = auVar46._0_8_;
            if (dVar56 < 0.0) {
              local_270[2] = local_188.m_data[3];
              local_198 = local_188.m_data[0];
              local_110 = local_188.m_data[2];
              local_118 = local_258.m_data[3];
              local_68 = local_258.m_data[0];
              local_70 = local_258.m_data[2];
              local_78 = local_188.m_data[1];
              local_80 = local_258.m_data[1];
              dVar206 = sqrt(dVar56);
              auVar234._8_8_ = 0;
              auVar234._0_8_ = local_70;
              auVar87._8_8_ = 0;
              auVar87._0_8_ = local_118;
              auVar198._8_8_ = 0;
              auVar198._0_8_ = local_110;
              auVar188._8_8_ = 0;
              auVar188._0_8_ = local_198;
              auVar176._8_8_ = 0;
              auVar176._0_8_ = local_270[2];
              dVar39 = local_68;
              dVar53 = local_78;
              dVar54 = local_80;
            }
            else {
              auVar45 = vsqrtsd_avx(auVar45,auVar45);
              dVar206 = auVar45._0_8_;
              dVar39 = local_258.m_data[0];
              dVar53 = local_188.m_data[1];
              dVar54 = local_258.m_data[1];
            }
            auVar226._8_8_ = 0;
            auVar226._0_8_ = dVar39;
            auVar119._8_8_ = 0;
            auVar119._0_8_ = dVar53 * dVar54;
            auVar45 = vfmadd213sd_fma(auVar226,auVar188,auVar119);
            auVar45 = vfmadd213sd_fma(auVar234,auVar198,auVar45);
            auVar45 = vfmadd213sd_fma(auVar87,auVar176,auVar45);
            local_270[2] = dVar206;
            dVar39 = atan2(dVar206,auVar45._0_8_);
            dVar56 = 1.0 / local_270[2];
            dVar54 = dVar56 * auVar47._0_8_;
            dVar55 = dVar56 * dVar55;
            dVar56 = dVar56 * local_270[1];
            auVar62._8_8_ = 0;
            auVar62._0_8_ = dVar55 * dVar55;
            auVar88._8_8_ = 0;
            auVar88._0_8_ = dVar54;
            auVar45 = vfmadd231sd_fma(auVar62,auVar88,auVar88);
            auVar177._8_8_ = 0;
            auVar177._0_8_ = dVar56;
            auVar45 = vfmadd231sd_fma(auVar45,auVar177,auVar177);
            if (auVar45._0_8_ < 0.0) {
              local_270[1] = dVar56;
              local_270[2] = dVar39;
              dVar57 = sqrt(auVar45._0_8_);
              dVar56 = local_270[1];
              dVar39 = local_270[2];
            }
            else {
              auVar45 = vsqrtsd_avx(auVar45,auVar45);
              dVar57 = auVar45._0_8_;
            }
            dVar39 = dVar39 + dVar39;
            bVar21 = 2.2250738585072014e-308 <= dVar57;
            dVar57 = 1.0 / dVar57;
            dVar53 = (double)((ulong)bVar21 * (long)(dVar55 * dVar57));
            dVar206 = (double)((ulong)bVar21 * (long)(dVar54 * dVar57) +
                              (ulong)!bVar21 * 0x3ff0000000000000);
            dVar54 = (double)((ulong)bVar21 * (long)(dVar56 * dVar57));
          }
          if (dVar39 <= 3.141592653589793) {
            if (dVar39 < -3.141592653589793) {
              dVar39 = dVar39 + 6.283185307179586;
            }
          }
          else {
            dVar39 = dVar39 + -6.283185307179586;
          }
          if (((long)local_2a8._8_8_ < 2) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
          dVar55 = *(double *)(local_2a8._0_8_ + (local_298 + uVar32) * 8);
          local_278 = local_278 + dVar39 * dVar206 * dVar55;
          local_270[0] = local_270[0] + dVar39 * dVar53 * dVar55;
          local_2d8 = local_2d8 + dVar39 * dVar54 * dVar55;
          uVar32 = uVar32 + 1;
          lVar41 = lVar41 + 0x38;
          lVar28 = lVar28 + 7;
        } while (uVar32 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_2b8 = 0.0;
        local_270[1] = 0.0;
        local_2c0 = 0.0;
      }
      else {
        local_2c0 = 0.0;
        lVar28 = 0x18;
        lVar42 = 3;
        lVar31 = 3;
        lVar41 = 0x18;
        uVar32 = 0;
        local_270[1] = 0.0;
        local_2b8 = 0.0;
        do {
          local_218.m_data[0] =
               (double)((long)(state_x->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + lVar41);
          local_1e8 = (state_x->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_218.m_data[1] = 1.97626258336499e-323;
          local_218.m_data[3] = (double)state_x;
          local_1f8 = lVar31;
          if (local_1e8 + -4 < lVar31) goto LAB_006a1981;
          ChQuaternion<double>::
          ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&local_258,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_218,(type *)0x0);
          local_218.m_data[0] =
               (double)((long)(local_128->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + lVar28);
          local_1e8 = (local_128->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_218.m_data[1] = 1.48219693752374e-323;
          local_218.m_data[3] = (double)local_128;
          local_1f8 = lVar42;
          if (local_1e8 + -3 < lVar42) goto LAB_006a1981;
          ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&local_238,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_218,(type *)0x0);
          if (((long)local_2a8._8_8_ < 2) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
          dVar55 = local_258.m_data[0] * local_258.m_data[0];
          auVar47 = ZEXT816(0xbff0000000000000);
          auVar49 = ZEXT816(0x4000000000000000);
          auVar132._8_8_ = 0;
          auVar132._0_8_ = dVar55 + local_258.m_data[1] * local_258.m_data[1];
          auVar45 = vfmadd213sd_fma(auVar132,auVar49,auVar47);
          dVar39 = local_258.m_data[1] * local_258.m_data[2] -
                   local_258.m_data[0] * local_258.m_data[3];
          auVar227._8_8_ = 0;
          auVar227._0_8_ = local_238.m_data[0];
          auVar178._8_8_ = 0;
          auVar178._0_8_ = local_238.m_data[1] * (dVar39 + dVar39);
          auVar45 = vfmadd231sd_fma(auVar178,auVar227,auVar45);
          dVar39 = local_258.m_data[0] * local_258.m_data[2] +
                   local_258.m_data[1] * local_258.m_data[3];
          auVar242._8_8_ = 0;
          auVar242._0_8_ = local_238.m_data[2];
          auVar133._8_8_ = 0;
          auVar133._0_8_ = dVar39 + dVar39;
          auVar45 = vfmadd213sd_fma(auVar133,auVar242,auVar45);
          dVar39 = local_258.m_data[1] * local_258.m_data[2] +
                   local_258.m_data[0] * local_258.m_data[3];
          auVar162._8_8_ = 0;
          auVar162._0_8_ = dVar55 + local_258.m_data[2] * local_258.m_data[2];
          auVar46 = vfmadd213sd_fma(auVar162,auVar49,auVar47);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = dVar39 + dVar39;
          auVar163._8_8_ = 0;
          auVar163._0_8_ = local_238.m_data[1] * auVar46._0_8_;
          auVar46 = vfmadd231sd_fma(auVar163,auVar227,auVar63);
          dVar39 = local_258.m_data[2] * local_258.m_data[3] -
                   local_258.m_data[0] * local_258.m_data[1];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = dVar39 + dVar39;
          auVar46 = vfmadd213sd_fma(auVar64,auVar242,auVar46);
          dVar53 = local_258.m_data[1] * local_258.m_data[3] -
                   local_258.m_data[0] * local_258.m_data[2];
          dVar39 = local_258.m_data[0] * local_258.m_data[1] +
                   local_258.m_data[2] * local_258.m_data[3];
          auVar89._8_8_ = 0;
          auVar89._0_8_ = dVar53 + dVar53;
          auVar149._8_8_ = 0;
          auVar149._0_8_ = local_238.m_data[1] * (dVar39 + dVar39);
          auVar48 = vfmadd231sd_fma(auVar149,auVar227,auVar89);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = dVar55 + local_258.m_data[3] * local_258.m_data[3];
          auVar47 = vfmadd213sd_fma(auVar90,auVar49,auVar47);
          auVar47 = vfmadd213sd_fma(auVar47,auVar242,auVar48);
          dVar39 = *(double *)(local_2a8._0_8_ + (local_298 + uVar32) * 8);
          local_2c0 = local_2c0 + auVar45._0_8_ * dVar39;
          local_270[1] = local_270[1] + auVar46._0_8_ * dVar39;
          local_2b8 = local_2b8 + auVar47._0_8_ * dVar39;
          uVar32 = uVar32 + 1;
          lVar41 = lVar41 + 0x38;
          lVar31 = lVar31 + 7;
          lVar28 = lVar28 + 0x30;
          lVar42 = lVar42 + 6;
        } while (uVar32 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      Fi = local_e8;
      lVar28 = local_120;
      auVar91._0_8_ = 1.0 / local_d8;
      auVar91._8_8_ = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_2f0;
      auVar45 = vmulsd_avx512f(auVar91,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_2d0;
      auVar46 = vmulsd_avx512f(auVar91,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_2e0;
      auVar47 = vmulsd_avx512f(auVar91,auVar4);
      local_2b0 = auVar91._0_8_ * local_2b0;
      dVar39 = auVar91._0_8_ * local_270[1];
      auVar189._8_8_ = 0;
      auVar189._0_8_ = local_1c8;
      auVar48 = vmulsd_avx512f(auVar46,auVar189);
      auVar199._8_8_ = 0;
      auVar199._0_8_ = local_1e0;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = local_1d8;
      auVar48 = vfmadd231sd_avx512f(auVar48,auVar199,auVar45);
      auVar208._8_8_ = 0;
      auVar208._0_8_ = local_1b0;
      auVar48 = vfmadd231sd_avx512f(auVar48,auVar208,auVar47);
      auVar251._8_8_ = 0;
      auVar251._0_8_ = local_1c0;
      auVar49 = vmulsd_avx512f(auVar46,auVar251);
      auVar49 = vfmadd231sd_avx512f(auVar49,auVar134,auVar45);
      auVar262 = ZEXT864((ulong)local_1a8);
      auVar260._8_8_ = 0;
      auVar260._0_8_ = local_1a8;
      auVar49 = vfmadd231sd_avx512f(auVar49,auVar260,auVar47);
      vmovsd_avx512f(auVar46);
      auVar265._8_8_ = 0;
      auVar265._0_8_ = local_1b8;
      auVar46 = vmulsd_avx512f(auVar46,auVar265);
      vmovsd_avx512f(auVar45);
      auVar263._8_8_ = 0;
      auVar263._0_8_ = local_1d0;
      auVar45 = vfmadd231sd_avx512f(auVar46,auVar263,auVar45);
      vmovsd_avx512f(auVar47);
      auVar267._8_8_ = 0;
      auVar267._0_8_ = local_1a0;
      auVar45 = vfmadd231sd_avx512f(auVar45,auVar267,auVar47);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = DAT_00b90ae0;
      auVar45 = vsubsd_avx512f(auVar45,auVar5);
      pCVar33 = (this->strain_e_0).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_168.m_data._0_16_ = vxorpd_avx512vl(auVar47,auVar47);
      local_238.m_data[1] = (auVar49._0_8_ - DAT_00b90ad8) - pCVar33[local_120].m_data[1];
      local_238.m_data[0] = (auVar48._0_8_ - VECT_X) - pCVar33[local_120].m_data[0];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pCVar33[local_120].m_data[2];
      auVar45 = vsubsd_avx512f(auVar45,auVar6);
      local_238.m_data[2] = auVar45._0_8_;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = auVar91._0_8_ * local_2e8;
      auVar243._8_8_ = 0;
      auVar243._0_8_ = local_2b0 * (double)local_1c8;
      auVar45 = vfmadd231sd_fma(auVar243,auVar199,auVar218);
      auVar235._8_8_ = 0;
      auVar235._0_8_ = auVar91._0_8_ * (double)local_288._0_8_;
      auVar45 = vfmadd231sd_fma(auVar45,auVar208,auVar235);
      auVar257._8_8_ = 0;
      auVar257._0_8_ = local_2b0 * local_1c0;
      auVar46 = vfmadd231sd_fma(auVar257,auVar134,auVar218);
      auVar46 = vfmadd231sd_avx512f(auVar46,auVar260,auVar235);
      auVar228._8_8_ = 0;
      auVar228._0_8_ = local_2b0;
      auVar47 = vmulsd_avx512f(auVar228,auVar265);
      auVar219._8_8_ = 0;
      auVar219._0_8_ = auVar91._0_8_ * local_2e8;
      auVar47 = vfmadd231sd_avx512f(auVar47,auVar263,auVar219);
      auVar236._8_8_ = 0;
      auVar236._0_8_ = auVar91._0_8_ * (double)local_288._0_8_;
      auVar47 = vfmadd231sd_avx512f(auVar47,auVar267,auVar236);
      local_d0.m_data[0] = auVar45._0_8_;
      local_d0.m_data[1] = auVar46._0_8_;
      local_d0.m_data[2] = auVar47._0_8_;
      pCVar33 = (this->strain_k_0).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_108.m_data[1] = auVar91._0_8_ * local_270[0] - pCVar33[local_120].m_data[1];
      local_108.m_data[0] = auVar91._0_8_ * local_278 - pCVar33[local_120].m_data[0];
      local_108.m_data[2] = auVar91._0_8_ * local_2d8 - pCVar33[local_120].m_data[2];
      auVar65._8_8_ = 0;
      auVar65._0_8_ = auVar91._0_8_ * local_2c0;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = dVar39 * (double)local_1c8;
      auVar45 = vfmadd231sd_fma(auVar150,auVar65,auVar199);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = auVar91._0_8_ * local_2b8;
      auVar45 = vfmadd231sd_fma(auVar45,auVar92,auVar208);
      auVar164._8_8_ = 0;
      auVar164._0_8_ = local_1c0 * dVar39;
      auVar46 = vfmadd231sd_fma(auVar164,auVar65,auVar134);
      auVar261._8_8_ = 0;
      auVar261._0_8_ = local_1a8;
      auVar46 = vfmadd231sd_avx512f(auVar46,auVar92,auVar261);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = dVar39;
      auVar266._8_8_ = 0;
      auVar266._0_8_ = local_1b8;
      auVar47 = vmulsd_avx512f(auVar120,auVar266);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = auVar91._0_8_ * local_2c0;
      auVar264._8_8_ = 0;
      auVar264._0_8_ = local_1d0;
      auVar47 = vfmadd231sd_avx512f(auVar47,auVar264,auVar66);
      auVar93._8_8_ = 0;
      auVar93._0_8_ = auVar91._0_8_ * local_2b8;
      auVar268._8_8_ = 0;
      auVar268._0_8_ = local_1a0;
      auVar47 = vfmadd231sd_avx512f(auVar47,auVar268,auVar93);
      local_60 = auVar45._0_8_;
      local_58 = auVar46._0_8_;
      local_50 = auVar47._0_8_;
      local_148.m_data[2] = 0.0;
      local_168.m_data[2] = 0.0;
      local_98.
      super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      peVar10 = (this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      peVar11 = (peVar10->plasticity).
                super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      p_Var12 = (peVar10->plasticity).
                super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        }
      }
      local_148.m_data._0_16_ = local_168.m_data._0_16_;
      local_98.
      super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = local_168.m_data._0_16_;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      if ((peVar11 != (element_type *)0x0) && ((char)local_18c != '\0')) {
        peVar10 = (this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar11 = (peVar10->plasticity).
                  super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var12 = (peVar10->plasticity).
                  super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          }
        }
        (*peVar11->_vptr_ChPlasticityCosserat[4])(peVar11,1,&local_98);
        lVar28 = local_120;
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          lVar28 = local_120;
        }
      }
      peVar10 = (this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      (*(peVar10->super_ChBeamSection)._vptr_ChBeamSection[2])(peVar10,&local_148,&local_168);
      if ((char)local_18c == '\0') {
        pCVar33 = (this->stress_n).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar28;
        if (&local_148 != pCVar33) {
          pCVar33->m_data[0] = local_148.m_data[0];
          pCVar33->m_data[1] = local_148.m_data[1];
          pCVar33->m_data[2] = local_148.m_data[2];
        }
        pCVar33 = (this->stress_m).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar28;
        if (&local_168 != pCVar33) {
          pCVar33->m_data[0] = local_168.m_data[0];
          pCVar33->m_data[1] = local_168.m_data[1];
          pCVar33->m_data[2] = local_168.m_data[2];
        }
        pCVar34 = (this->strain_e).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar28;
        if (&local_238 != pCVar34) {
          pCVar34->m_data[0] = local_238.m_data[0];
          pCVar34->m_data[1] = local_238.m_data[1];
          pCVar34->m_data[2] = local_238.m_data[2];
        }
        pCVar34 = (this->strain_k).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar28;
        if (&local_108 != pCVar34) {
          pCVar34->m_data[0] = local_108.m_data[0];
          pCVar34->m_data[1] = local_108.m_data[1];
          pCVar34->m_data[2] = local_108.m_data[2];
        }
      }
      peVar10 = (this->section).
                super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      peVar13 = (peVar10->damping).
                super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      p_Var12 = (peVar10->damping).
                super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        }
      }
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      if (peVar13 != (element_type *)0x0) {
        local_218.m_data[0] = 0.0;
        local_218.m_data[1] = 0.0;
        local_218.m_data[2] = 0.0;
        local_258.m_data[2] = 0.0;
        local_258.m_data[0] = 0.0;
        local_258.m_data[1] = 0.0;
        peVar10 = (this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        peVar13 = (peVar10->damping).
                  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var12 = (peVar10->damping).
                  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          }
        }
        (*peVar13->_vptr_ChDampingCosserat[2])(peVar13,&local_218,&local_258);
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
        }
        local_148.m_data[1] = local_218.m_data[1] + local_148.m_data[1];
        local_148.m_data[0] = local_218.m_data[0] + local_148.m_data[0];
        local_148.m_data[2] = local_218.m_data[2] + local_148.m_data[2];
        local_168.m_data[1] = local_258.m_data[1] + local_168.m_data[1];
        local_168.m_data[0] = local_258.m_data[0] + local_168.m_data[0];
        local_168.m_data[2] = local_258.m_data[2] + local_168.m_data[2];
      }
      auVar45 = auVar262._0_16_;
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        auVar67._8_8_ = 0;
        auVar67._0_8_ = local_1e0;
        auVar121._8_8_ = 0;
        auVar121._0_8_ = local_148.m_data[0];
        auVar229._8_8_ = 0;
        auVar229._0_8_ = local_1d8 * local_148.m_data[1];
        auVar45 = vfmadd231sd_fma(auVar229,auVar67,auVar121);
        auVar151._8_8_ = 0;
        auVar151._0_8_ = local_1d0;
        auVar165._8_8_ = 0;
        auVar165._0_8_ = local_148.m_data[2];
        auVar46 = vfmadd231sd_fma(auVar45,auVar151,auVar165);
        auVar179._8_8_ = 0;
        auVar179._0_8_ = local_1c8;
        auVar237._8_8_ = 0;
        auVar237._0_8_ = local_148.m_data[1] * local_1c0;
        auVar45 = vfmadd231sd_fma(auVar237,auVar179,auVar121);
        auVar200._8_8_ = 0;
        auVar200._0_8_ = local_1b8;
        auVar47 = vfmadd231sd_fma(auVar45,auVar200,auVar165);
        auVar209._8_8_ = 0;
        auVar209._0_8_ = local_1b0;
        auVar244._8_8_ = 0;
        auVar244._0_8_ = local_1a8 * local_148.m_data[1];
        auVar45 = vfmadd231sd_fma(auVar244,auVar209,auVar121);
        auVar122._8_8_ = 0;
        auVar122._0_8_ = local_1a0;
        auVar45 = vfmadd231sd_fma(auVar45,auVar122,auVar165);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = local_168.m_data[0];
        auVar94._8_8_ = 0;
        auVar94._0_8_ = local_1d8 * local_168.m_data[1];
        auVar48 = vfmadd231sd_fma(auVar94,auVar135,auVar67);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = local_168.m_data[2];
        auVar48 = vfmadd231sd_fma(auVar48,auVar68,auVar151);
        auVar95._8_8_ = 0;
        auVar95._0_8_ = local_1c0 * local_168.m_data[1];
        auVar49 = vfmadd231sd_fma(auVar95,auVar135,auVar179);
        auVar49 = vfmadd231sd_fma(auVar49,auVar68,auVar200);
        auVar96._8_8_ = 0;
        auVar96._0_8_ = local_1a8 * local_168.m_data[1];
        auVar159 = vfmadd231sd_fma(auVar96,auVar209,auVar135);
        auVar159 = vfmadd231sd_fma(auVar159,auVar122,auVar68);
        auVar22._8_8_ = uStack_40;
        auVar22._0_8_ = local_48;
        auVar18._8_8_ = 0x8000000000000000;
        auVar18._0_8_ = 0x8000000000000000;
        auVar50 = vxorpd_avx512vl(auVar22,auVar18);
        dVar39 = auVar50._0_8_ * local_130;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_2f0;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = local_2e0;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = auVar46._0_8_ * local_2f0;
        auVar50 = vfmsub231sd_fma(auVar136,auVar97,auVar47);
        local_270[0] = auVar50._0_8_;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = local_288._0_8_;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = auVar45._0_8_ * local_2e0;
        auVar50 = vfmsub231sd_fma(auVar137,auVar98,auVar46);
        local_278 = auVar50._0_8_;
        dVar55 = auVar47._0_8_ * (double)local_288._0_8_;
        local_288._0_8_ = auVar45._0_8_;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = dVar55;
        auVar50 = vfmsub231sd_fma(auVar99,auVar45,auVar69);
        dVar55 = dVar39 * local_d8;
        lVar41 = 0x18;
        lVar28 = 0;
        uVar32 = 0;
        do {
          if (((long)local_2a8._8_8_ < 2) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
          dVar53 = *(double *)(local_2a8._0_8_ + (local_298 + uVar32) * 8);
          local_b8[0] = dVar39 * dVar53 * auVar46._0_8_;
          local_b8[1] = dVar39 * dVar53 * auVar47._0_8_;
          local_b8[2] = dVar39 * dVar53 * (double)local_288._0_8_;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              + -3 < (long)(uVar32 * 6)) goto LAB_006a1981;
          pdVar37 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          uVar35 = 3;
          if ((((ulong)(pdVar37 + uVar32 * 6) & 7) == 0) &&
             (uVar35 = (ulong)(-((uint)((ulong)(pdVar37 + uVar32 * 6) >> 3) & 0x1fffffff) & 7),
             2 < uVar35)) {
            uVar35 = 3;
          }
          if (uVar35 != 0) {
            uVar36 = 0;
            do {
              *(double *)((long)pdVar37 + uVar36 * 8 + lVar28) =
                   local_b8[uVar36] + *(double *)((long)pdVar37 + uVar36 * 8 + lVar28);
              uVar36 = uVar36 + 1;
            } while (uVar35 != uVar36);
          }
          if (uVar35 < 3) {
            do {
              *(double *)((long)pdVar37 + uVar35 * 8 + lVar28) =
                   local_b8[uVar35] + *(double *)((long)pdVar37 + uVar35 * 8 + lVar28);
              uVar35 = uVar35 + 1;
            } while (uVar35 != 3);
          }
          local_1f8 = uVar32 * 7 + 3;
          local_218.m_data[0] =
               (double)((state_x->super_ChVectorDynamic<double>).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data + uVar32 * 7 + 3);
          local_1e8 = (state_x->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_218.m_data[1] = 1.97626258336499e-323;
          local_218.m_data[3] = (double)state_x;
          if (local_1e8 + -4 < local_1f8) goto LAB_006a1981;
          ChQuaternion<double>::
          ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&local_258,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_218,(type *)0x0);
          auVar45 = auVar262._0_16_;
          if (((long)local_2a8._8_8_ < 2) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
          dVar53 = ((double *)(local_2a8._0_8_ + uVar32 * 8))[local_298];
          dVar54 = *(double *)(local_2a8._0_8_ + uVar32 * 8);
          dVar206 = dVar39 * dVar53 * auVar48._0_8_ - dVar55 * dVar54 * auVar50._0_8_;
          dVar56 = dVar39 * dVar53 * auVar49._0_8_ - dVar55 * dVar54 * local_278;
          dVar57 = dVar39 * dVar53 * auVar159._0_8_ - dVar55 * dVar54 * local_270[0];
          auVar138._8_8_ = 0;
          auVar138._0_8_ = local_258.m_data[0];
          dVar54 = local_258.m_data[0] * local_258.m_data[0];
          auVar19._8_8_ = 0x8000000000000000;
          auVar19._0_8_ = 0x8000000000000000;
          auVar51 = vxorpd_avx512vl(auVar138,auVar19);
          dVar44 = auVar51._0_8_;
          auVar215 = ZEXT816(0xbff0000000000000);
          auVar240 = ZEXT816(0x4000000000000000);
          auVar180._8_8_ = 0;
          auVar180._0_8_ = dVar54 + local_258.m_data[1] * local_258.m_data[1];
          auVar51 = vfmadd213sd_fma(auVar180,auVar240,auVar215);
          dVar53 = local_258.m_data[1] * local_258.m_data[2] - local_258.m_data[3] * dVar44;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = dVar206;
          auVar210._8_8_ = 0;
          auVar210._0_8_ = (dVar53 + dVar53) * dVar56;
          auVar51 = vfmadd231sd_fma(auVar210,auVar70,auVar51);
          dVar53 = local_258.m_data[2] * dVar44 + local_258.m_data[3] * local_258.m_data[1];
          auVar100._8_8_ = 0;
          auVar100._0_8_ = dVar57;
          auVar181._8_8_ = 0;
          auVar181._0_8_ = dVar53 + dVar53;
          auVar51 = vfmadd213sd_fma(auVar181,auVar100,auVar51);
          dVar53 = local_258.m_data[1] * local_258.m_data[2] + local_258.m_data[3] * dVar44;
          auVar201._8_8_ = 0;
          auVar201._0_8_ = local_258.m_data[2] * local_258.m_data[2] + dVar54;
          auVar196 = vfmadd213sd_fma(auVar201,auVar240,auVar215);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = dVar53 + dVar53;
          auVar202._8_8_ = 0;
          auVar202._0_8_ = auVar196._0_8_ * dVar56;
          auVar196 = vfmadd231sd_fma(auVar202,auVar70,auVar139);
          dVar53 = local_258.m_data[3] * local_258.m_data[2] - local_258.m_data[1] * dVar44;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = dVar53 + dVar53;
          auVar196 = vfmadd213sd_fma(auVar140,auVar100,auVar196);
          dVar147 = local_258.m_data[3] * local_258.m_data[1] - local_258.m_data[2] * dVar44;
          dVar53 = local_258.m_data[1] * dVar44 + local_258.m_data[3] * local_258.m_data[2];
          auVar71._8_8_ = 0;
          auVar71._0_8_ = dVar206;
          auVar123._8_8_ = 0;
          auVar123._0_8_ = dVar56 * (dVar53 + dVar53);
          auVar152._8_8_ = 0;
          auVar152._0_8_ = dVar147 + dVar147;
          auVar233 = vfmadd231sd_fma(auVar123,auVar71,auVar152);
          auVar72._8_8_ = 0;
          auVar72._0_8_ = local_258.m_data[3] * local_258.m_data[3] + dVar54;
          auVar215 = vfmadd213sd_fma(auVar72,auVar240,auVar215);
          auVar101._8_8_ = 0;
          auVar101._0_8_ = dVar57;
          auVar215 = vfmadd213sd_fma(auVar215,auVar101,auVar233);
          local_218.m_data[0] = (double)auVar51._0_8_;
          local_218.m_data[1] = auVar196._0_8_;
          local_218.m_data[2] = auVar215._0_8_;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              + -3 < (long)(uVar32 * 6 + 3)) goto LAB_006a1981;
          pdVar37 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          uVar35 = 3;
          if ((((ulong)(pdVar37 + uVar32 * 6 + 3) & 7) == 0) &&
             (uVar35 = (ulong)(-((uint)((ulong)(pdVar37 + uVar32 * 6 + 3) >> 3) & 0x1fffffff) & 7),
             2 < uVar35)) {
            uVar35 = 3;
          }
          if (uVar35 != 0) {
            uVar36 = 0;
            do {
              *(double *)((long)pdVar37 + uVar36 * 8 + lVar41) =
                   local_218.m_data[uVar36] + *(double *)((long)pdVar37 + uVar36 * 8 + lVar41);
              uVar36 = uVar36 + 1;
            } while (uVar35 != uVar36);
          }
          if (uVar35 < 3) {
            lVar31 = uVar35 + 3;
            do {
              *(double *)((long)pdVar37 + lVar31 * 8 + lVar28) =
                   local_238.m_data[lVar31 + 1] + *(double *)((long)pdVar37 + lVar31 * 8 + lVar28);
              lVar31 = lVar31 + 1;
            } while (lVar31 != 6);
          }
          uVar32 = uVar32 + 1;
          lVar28 = lVar28 + 0x30;
          lVar41 = lVar41 + 0x30;
        } while (uVar32 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      std::
      vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
      ::~vector(&local_98);
      if ((double *)local_2a8._0_8_ != (double *)0x0) {
        free(*(void **)(local_2a8._0_8_ + -8));
      }
      lVar28 = local_120 + 1;
    } while (lVar28 < this->int_order_b);
  }
  if (add_gyroscopic_terms != '\0') {
    if (lumped_mass == '\x01') {
      local_188.m_data[2] = 0.0;
      local_188.m_data[0] = 0.0;
      local_188.m_data[1] = 0.0;
      local_258.m_data[2] = 0.0;
      local_258.m_data[0] = 0.0;
      local_258.m_data[1] = 0.0;
      if ((this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->nodes).
          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        auVar45 = vcvtusi2sd_avx512f(auVar45,(long)(this->nodes).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->nodes).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4);
        dVar39 = (this->super_ChElementBeam).length / auVar45._0_8_;
        lVar41 = 0x18;
        lVar28 = 0;
        uVar32 = 0;
        do {
          peVar10 = (this->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          peVar14 = (peVar10->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          p_Var12 = (peVar10->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
            }
          }
          local_1c0 = (double)(uVar32 * 6 + 3);
          local_1e0 = (local_128->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data + uVar32 * 6 + 3;
          local_1b0 = (local_128->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_1d8 = 1.48219693752374e-323;
          local_1c8 = local_128;
          local_288._0_8_ = local_1c0;
          if ((long)(local_1b0 - 3) < (long)local_1c0) {
LAB_006a1981:
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                         );
          }
          ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    ((ChVector<double> *)&local_218,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_1e0,(type *)0x0);
          (*peVar14->_vptr_ChInertiaCosserat[5])(peVar14,&local_188,&local_258,&local_218);
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          }
          local_1c0 = (double)(uVar32 * 7 + 3);
          local_1e0 = (state_x->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data + uVar32 * 7 + 3;
          local_1b0 = (state_x->super_ChVectorDynamic<double>).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows;
          local_1d8 = 1.97626258336499e-323;
          local_1c8 = (ChStateDelta *)state_x;
          if ((long)(local_1b0 - 4) < (long)local_1c0) goto LAB_006a1981;
          ChQuaternion<double>::
          ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&local_218,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_1e0,(type *)0x0);
          dVar53 = local_218.m_data[0] * local_218.m_data[0];
          auVar47 = ZEXT816(0xbff0000000000000);
          auVar49 = ZEXT816(0x4000000000000000);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = dVar53 + local_218.m_data[1] * local_218.m_data[1];
          auVar45 = vfmadd213sd_fma(auVar141,auVar49,auVar47);
          dVar55 = local_218.m_data[1] * local_218.m_data[2] -
                   local_218.m_data[0] * local_218.m_data[3];
          auVar230._8_8_ = 0;
          auVar230._0_8_ = local_188.m_data[0];
          auVar182._8_8_ = 0;
          auVar182._0_8_ = local_188.m_data[1] * (dVar55 + dVar55);
          auVar45 = vfmadd231sd_fma(auVar182,auVar230,auVar45);
          dVar55 = local_218.m_data[0] * local_218.m_data[2] +
                   local_218.m_data[1] * local_218.m_data[3];
          auVar245._8_8_ = 0;
          auVar245._0_8_ = local_188.m_data[2];
          auVar142._8_8_ = 0;
          auVar142._0_8_ = dVar55 + dVar55;
          auVar45 = vfmadd213sd_fma(auVar142,auVar245,auVar45);
          dVar55 = local_218.m_data[1] * local_218.m_data[2] +
                   local_218.m_data[0] * local_218.m_data[3];
          auVar166._8_8_ = 0;
          auVar166._0_8_ = dVar53 + local_218.m_data[2] * local_218.m_data[2];
          auVar46 = vfmadd213sd_fma(auVar166,auVar49,auVar47);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = dVar55 + dVar55;
          auVar167._8_8_ = 0;
          auVar167._0_8_ = local_188.m_data[1] * auVar46._0_8_;
          auVar46 = vfmadd231sd_fma(auVar167,auVar230,auVar73);
          dVar55 = local_218.m_data[2] * local_218.m_data[3] -
                   local_218.m_data[0] * local_218.m_data[1];
          auVar74._8_8_ = 0;
          auVar74._0_8_ = dVar55 + dVar55;
          auVar46 = vfmadd213sd_fma(auVar74,auVar245,auVar46);
          dVar54 = local_218.m_data[1] * local_218.m_data[3] -
                   local_218.m_data[0] * local_218.m_data[2];
          dVar55 = local_218.m_data[0] * local_218.m_data[1] +
                   local_218.m_data[2] * local_218.m_data[3];
          auVar102._8_8_ = 0;
          auVar102._0_8_ = dVar54 + dVar54;
          auVar153._8_8_ = 0;
          auVar153._0_8_ = local_188.m_data[1] * (dVar55 + dVar55);
          auVar48 = vfmadd231sd_fma(auVar153,auVar230,auVar102);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = dVar53 + local_218.m_data[3] * local_218.m_data[3];
          auVar47 = vfmadd213sd_fma(auVar103,auVar49,auVar47);
          auVar47 = vfmadd213sd_fma(auVar47,auVar245,auVar48);
          local_1e0 = auVar45._0_8_;
          local_1d8 = auVar46._0_8_;
          local_1d0 = auVar47._0_8_;
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              + -3 < (long)(uVar32 * 6)) goto LAB_006a1981;
          pdVar37 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          uVar35 = 3;
          if ((((ulong)(pdVar37 + uVar32 * 6) & 7) == 0) &&
             (uVar35 = (ulong)(-((uint)((ulong)(pdVar37 + uVar32 * 6) >> 3) & 0x1fffffff) & 7),
             2 < uVar35)) {
            uVar35 = 3;
          }
          if (uVar35 != 0) {
            uVar36 = 0;
            do {
              *(double *)((long)pdVar37 + uVar36 * 8 + lVar28) =
                   *(double *)((long)pdVar37 + uVar36 * 8 + lVar28) -
                   dVar39 * (double)(&local_1e0)[uVar36];
              uVar36 = uVar36 + 1;
            } while (uVar35 != uVar36);
          }
          if (uVar35 < 3) {
            do {
              *(double *)((long)pdVar37 + uVar35 * 8 + lVar28) =
                   *(double *)((long)pdVar37 + uVar35 * 8 + lVar28) -
                   dVar39 * (double)(&local_1e0)[uVar35];
              uVar35 = uVar35 + 1;
            } while (uVar35 != 3);
          }
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              + -3 < (long)local_288._0_8_) goto LAB_006a1981;
          pdVar37 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          uVar35 = 3;
          if ((((ulong)(pdVar37 + local_288._0_8_) & 7) == 0) &&
             (uVar35 = (ulong)(-((uint)((ulong)(pdVar37 + local_288._0_8_) >> 3) & 0x1fffffff) & 7),
             2 < uVar35)) {
            uVar35 = 3;
          }
          if (uVar35 != 0) {
            uVar36 = 0;
            do {
              *(double *)((long)pdVar37 + uVar36 * 8 + lVar41) =
                   *(double *)((long)pdVar37 + uVar36 * 8 + lVar41) -
                   dVar39 * local_258.m_data[uVar36];
              uVar36 = uVar36 + 1;
            } while (uVar35 != uVar36);
          }
          if (uVar35 < 3) {
            lVar31 = uVar35 + 3;
            do {
              *(double *)((long)pdVar37 + lVar31 * 8 + lVar28) =
                   *(double *)((long)pdVar37 + lVar31 * 8 + lVar28) - dVar39 * local_270[lVar31];
              lVar31 = lVar31 + 1;
            } while (lVar31 != 6);
          }
          uVar32 = uVar32 + 1;
          lVar28 = lVar28 + 0x30;
          lVar41 = lVar41 + 0x30;
        } while (uVar32 < (ulong)((long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    else {
      local_188.m_data[0] = 0.0;
      local_188.m_data[1] = 0.0;
      local_188.m_data[2] = 0.0;
      local_258.m_data[2] = 0.0;
      local_258.m_data[0] = 0.0;
      local_258.m_data[1] = 0.0;
      if (0 < this->int_order_b) {
        lVar28 = 0;
        pCVar40 = local_f0;
        do {
          pCVar29 = ChQuadrature::GetStaticTables();
          auVar104._8_8_ = 0;
          auVar104._0_8_ =
               *(ulong *)(*(long *)&(pCVar29->Lroots).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(long)this->int_order_b + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + lVar28 * 8);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = local_e0;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_130;
          auVar45 = vfmadd132sd_fma(auVar104,auVar75,auVar7);
          pCVar29 = ChQuadrature::GetStaticTables();
          local_110 = *(double *)
                       (*(long *)&(pCVar29->Weight).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)this->int_order_b + -1].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       lVar28 * 8);
          local_118 = (this->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start[lVar28];
          iVar8 = this->order;
          local_2a8 = ZEXT816(0);
          local_298 = 0;
          lVar41 = (long)(int)((ulong)((long)(this->nodes).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4);
          if (lVar41 < 0) {
LAB_006a19a0:
            local_298 = 0;
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                          "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                         );
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                    ((DenseStorage<double,__1,__1,__1,_1> *)local_2a8,lVar41,1,lVar41);
          geometry::ChBasisToolsBspline::BasisEvaluateDeriv
                    (this->order,iVar8,auVar45._0_8_,pCVar40,(ChMatrixDynamic<> *)local_2a8);
          local_2f0 = VNULL;
          local_2e0 = DAT_00b90ac0;
          local_2d0 = DAT_00b90ac8;
          if ((this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar41 = 0x18;
            dVar39 = 1.48219693752374e-323;
            uVar32 = 0;
            do {
              local_1e0 = (double *)
                          ((long)(state_x->super_ChVectorDynamic<double>).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data + lVar41);
              local_1b0 = (state_x->super_ChVectorDynamic<double>).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows;
              local_1d8 = 1.97626258336499e-323;
              local_1c8 = (ChStateDelta *)state_x;
              local_1c0 = dVar39;
              if ((long)(local_1b0 - 4) < (long)dVar39) goto LAB_006a1981;
              ChQuaternion<double>::
              ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_218,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_1e0,(type *)0x0);
              dVar43 = local_218.m_data[3];
              dVar25 = local_218.m_data[0];
              peVar9 = (((this->nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              auVar190._8_8_ = 0;
              auVar190._0_8_ = *(double *)&peVar9->field_0x38;
              dVar55 = *(double *)&peVar9->field_0x40;
              auVar246._8_8_ = 0;
              auVar246._0_8_ = dVar55;
              dVar53 = *(double *)&peVar9->field_0x48;
              auVar203._8_8_ = 0;
              auVar203._0_8_ = dVar53;
              dVar54 = *(double *)&peVar9->field_0x50;
              auVar183._8_8_ = 0;
              auVar183._0_8_ = dVar54;
              auVar252._8_8_ = 0;
              auVar252._0_8_ = local_218.m_data[1];
              auVar238._8_8_ = 0;
              auVar238._0_8_ = local_218.m_data[2];
              auVar105._8_8_ = 0;
              auVar105._0_8_ = local_218.m_data[3];
              auVar168._8_8_ = 0;
              auVar168._0_8_ = local_218.m_data[0] * dVar55;
              auVar45 = vfmsub231sd_fma(auVar168,auVar190,auVar252);
              auVar45 = vfmadd231sd_fma(auVar45,auVar183,auVar238);
              auVar47 = vfnmadd231sd_fma(auVar45,auVar203,auVar105);
              auVar220._8_8_ = 0;
              auVar220._0_8_ = local_218.m_data[0] * dVar53;
              auVar45 = vfmsub231sd_fma(auVar220,auVar190,auVar238);
              auVar45 = vfnmadd231sd_fma(auVar45,auVar183,auVar252);
              auVar45 = vfmadd231sd_fma(auVar45,auVar246,auVar105);
              auVar258._8_8_ = 0;
              auVar258._0_8_ = local_218.m_data[0] * dVar54;
              auVar46 = vfmsub231sd_fma(auVar258,auVar190,auVar105);
              auVar46 = vfmadd231sd_fma(auVar46,auVar203,auVar252);
              auVar46 = vfnmadd231sd_fma(auVar46,auVar246,auVar238);
              dVar56 = auVar45._0_8_;
              auVar76._8_8_ = 0;
              auVar76._0_8_ = dVar56 * dVar56;
              auVar45 = vfmadd231sd_fma(auVar76,auVar47,auVar47);
              auVar45 = vfmadd231sd_fma(auVar45,auVar46,auVar46);
              dVar57 = 0.0;
              dVar52 = auVar45._0_8_;
              dVar44 = 1.0;
              dVar147 = 0.0;
              dVar206 = 0.0;
              if (0.0 < dVar52) {
                local_288._0_8_ = auVar47._0_8_;
                if (dVar52 < 0.0) {
                  local_270[1] = local_218.m_data[2];
                  local_198 = local_218.m_data[1];
                  local_278 = dVar53;
                  local_270[0] = *(double *)&peVar9->field_0x38;
                  local_270[2] = dVar55;
                  dVar53 = sqrt(dVar52);
                  auVar238._8_8_ = 0;
                  auVar238._0_8_ = local_270[1];
                  auVar203._8_8_ = 0;
                  auVar203._0_8_ = local_278;
                  auVar190._8_8_ = 0;
                  auVar190._0_8_ = local_270[0];
                  dVar55 = local_270[2];
                  dVar206 = local_198;
                }
                else {
                  auVar45 = vsqrtsd_avx(auVar45,auVar45);
                  dVar53 = auVar45._0_8_;
                  dVar206 = local_218.m_data[1];
                }
                auVar184._8_8_ = 0;
                auVar184._0_8_ = dVar54;
                auVar106._8_8_ = 0;
                auVar106._0_8_ = dVar43;
                auVar231._8_8_ = 0;
                auVar231._0_8_ = dVar25;
                auVar124._8_8_ = 0;
                auVar124._0_8_ = dVar55 * dVar206;
                auVar45 = vfmadd213sd_fma(auVar231,auVar190,auVar124);
                auVar45 = vfmadd213sd_fma(auVar238,auVar203,auVar45);
                auVar45 = vfmadd213sd_fma(auVar106,auVar184,auVar45);
                dVar206 = atan2(dVar53,auVar45._0_8_);
                dVar53 = 1.0 / dVar53;
                dVar55 = dVar53 * (double)local_288._0_8_;
                dVar56 = dVar53 * dVar56;
                dVar53 = dVar53 * auVar46._0_8_;
                auVar77._8_8_ = 0;
                auVar77._0_8_ = dVar56 * dVar56;
                auVar107._8_8_ = 0;
                auVar107._0_8_ = dVar55;
                auVar45 = vfmadd231sd_fma(auVar77,auVar107,auVar107);
                auVar169._8_8_ = 0;
                auVar169._0_8_ = dVar53;
                auVar45 = vfmadd231sd_fma(auVar45,auVar169,auVar169);
                if (auVar45._0_8_ < 0.0) {
                  local_288._0_8_ = dVar55;
                  dVar54 = sqrt(auVar45._0_8_);
                  dVar55 = (double)local_288._0_8_;
                }
                else {
                  auVar45 = vsqrtsd_avx(auVar45,auVar45);
                  dVar54 = auVar45._0_8_;
                }
                dVar206 = dVar206 + dVar206;
                bVar21 = 2.2250738585072014e-308 <= dVar54;
                dVar54 = 1.0 / dVar54;
                dVar44 = (double)((ulong)bVar21 * (long)(dVar55 * dVar54) +
                                 (ulong)!bVar21 * 0x3ff0000000000000);
                dVar57 = (double)((ulong)bVar21 * (long)(dVar56 * dVar54));
                dVar147 = (double)((ulong)bVar21 * (long)(dVar53 * dVar54));
              }
              if (dVar206 <= 3.141592653589793) {
                if (dVar206 < -3.141592653589793) {
                  dVar206 = dVar206 + 6.283185307179586;
                }
              }
              else {
                dVar206 = dVar206 + -6.283185307179586;
              }
              if (((long)local_2a8._8_8_ < 1) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
              dVar55 = *(double *)(local_2a8._0_8_ + uVar32 * 8);
              local_2f0 = local_2f0 + dVar206 * dVar44 * dVar55;
              local_2e0 = local_2e0 + dVar206 * dVar57 * dVar55;
              local_2d0 = local_2d0 + dVar206 * dVar147 * dVar55;
              uVar32 = uVar32 + 1;
              lVar41 = lVar41 + 0x38;
              dVar39 = (double)((long)dVar39 + 7);
            } while (uVar32 < (ulong)((long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          auVar108._8_8_ = 0;
          auVar108._0_8_ = local_2f0;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = local_2e0 * local_2e0;
          auVar45 = vfmadd231sd_fma(auVar78,auVar108,auVar108);
          auVar109._8_8_ = 0;
          auVar109._0_8_ = local_2d0;
          auVar45 = vfmadd231sd_fma(auVar45,auVar109,auVar109);
          dVar39 = auVar45._0_8_;
          local_288._0_8_ = 0x3ff0000000000000;
          local_2e8 = 0.5;
          if (1e-30 < dVar39) {
            if (dVar39 < 0.0) {
              dVar39 = sqrt(dVar39);
            }
            else {
              auVar45 = vsqrtsd_avx(auVar45,auVar45);
              dVar39 = auVar45._0_8_;
            }
            local_288._0_8_ = dVar39 * 0.5;
            local_2e8 = sin((double)local_288._0_8_);
            local_2e8 = local_2e8 / dVar39;
            local_288._0_8_ = cos((double)local_288._0_8_);
          }
          peVar9 = (((this->nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_270[0] = *(double *)&peVar9->field_0x38;
          dVar39 = *(double *)&peVar9->field_0x40;
          local_278 = *(double *)&peVar9->field_0x48;
          dVar55 = *(double *)&peVar9->field_0x50;
          local_238.m_data._0_16_ = ZEXT816(0);
          local_238.m_data[2] = 0.0;
          if ((this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar41 = 0x18;
            dVar54 = 1.48219693752374e-323;
            dVar53 = 1.48219693752374e-323;
            lVar31 = 0x18;
            uVar32 = 0;
            do {
              local_1e0 = (double *)
                          ((long)(state_x->super_ChVectorDynamic<double>).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data + lVar31);
              local_1b0 = (state_x->super_ChVectorDynamic<double>).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows;
              local_1d8 = 1.97626258336499e-323;
              local_1c8 = (ChStateDelta *)state_x;
              local_1c0 = dVar53;
              if ((long)(local_1b0 - 4) < (long)dVar53) goto LAB_006a1981;
              ChQuaternion<double>::
              ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_218,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_1e0,(type *)0x0);
              local_1e0 = (double *)
                          ((long)(local_128->super_ChVectorDynamic<double>).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data + lVar41);
              local_1b0 = (local_128->super_ChVectorDynamic<double>).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows;
              local_1d8 = 1.48219693752374e-323;
              local_1c8 = local_128;
              local_1c0 = dVar54;
              if ((long)(local_1b0 - 3) < (long)dVar54) goto LAB_006a1981;
              ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_d0,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_1e0,(type *)0x0);
              if (((long)local_2a8._8_8_ < 1) || (local_298 <= (long)uVar32)) goto LAB_006a1962;
              dVar56 = local_218.m_data[0] * local_218.m_data[0];
              auVar47 = ZEXT816(0xbff0000000000000);
              auVar154._8_8_ = 0;
              auVar154._0_8_ = dVar56 + local_218.m_data[3] * local_218.m_data[3];
              auVar46 = vfmadd213sd_avx512f(auVar154,ZEXT816(0x4000000000000000),auVar47);
              auVar170._8_8_ = 0;
              auVar170._0_8_ = local_d0.m_data[2];
              dVar57 = local_218.m_data[3] * local_218.m_data[1] -
                       local_218.m_data[0] * local_218.m_data[2];
              auVar221._8_8_ = 0;
              auVar221._0_8_ = local_d0.m_data[0];
              dVar206 = local_218.m_data[0] * local_218.m_data[1] +
                        local_218.m_data[3] * local_218.m_data[2];
              auVar211._8_8_ = 0;
              auVar211._0_8_ = dVar57 + dVar57;
              auVar253._8_8_ = 0;
              auVar253._0_8_ = local_d0.m_data[1] * (dVar206 + dVar206);
              auVar45 = vfmadd231sd_fma(auVar253,auVar221,auVar211);
              auVar45 = vfmadd231sd_fma(auVar45,auVar170,auVar46);
              dVar57 = local_218.m_data[3] * local_218.m_data[2] -
                       local_218.m_data[0] * local_218.m_data[1];
              dVar206 = local_218.m_data[1] * local_218.m_data[2] +
                        local_218.m_data[0] * local_218.m_data[3];
              auVar191._8_8_ = 0;
              auVar191._0_8_ = dVar56 + local_218.m_data[2] * local_218.m_data[2];
              auVar46 = vfmadd213sd_avx512f(auVar191,ZEXT816(0x4000000000000000),auVar47);
              auVar143._8_8_ = 0;
              auVar143._0_8_ = dVar206 + dVar206;
              auVar192._8_8_ = 0;
              auVar192._0_8_ = local_d0.m_data[1] * auVar46._0_8_;
              auVar46 = vfmadd231sd_fma(auVar192,auVar221,auVar143);
              auVar155._8_8_ = 0;
              auVar155._0_8_ = dVar57 + dVar57;
              auVar46 = vfmadd231sd_fma(auVar46,auVar170,auVar155);
              dVar206 = local_218.m_data[0] * local_218.m_data[2] +
                        local_218.m_data[3] * local_218.m_data[1];
              auVar110._8_8_ = 0;
              auVar110._0_8_ = dVar56 + local_218.m_data[1] * local_218.m_data[1];
              auVar47 = vfmadd213sd_avx512f(auVar110,ZEXT816(0x4000000000000000),auVar47);
              dVar56 = local_218.m_data[1] * local_218.m_data[2] -
                       local_218.m_data[0] * local_218.m_data[3];
              auVar79._8_8_ = 0;
              auVar79._0_8_ = local_d0.m_data[1] * (dVar56 + dVar56);
              auVar47 = vfmadd231sd_fma(auVar79,auVar221,auVar47);
              auVar144._8_8_ = 0;
              auVar144._0_8_ = dVar206 + dVar206;
              auVar47 = vfmadd231sd_fma(auVar47,auVar170,auVar144);
              dVar206 = *(double *)(local_2a8._0_8_ + uVar32 * 8);
              local_238.m_data[1] = dVar206 * auVar46._0_8_ + local_238.m_data[1];
              local_238.m_data[0] = dVar206 * auVar47._0_8_ + local_238.m_data[0];
              local_238.m_data[2] = auVar45._0_8_ * dVar206 + local_238.m_data[2];
              uVar32 = uVar32 + 1;
              lVar31 = lVar31 + 0x38;
              dVar53 = (double)((long)dVar53 + 7);
              lVar41 = lVar41 + 0x30;
              dVar54 = (double)((long)dVar54 + 6);
            } while (uVar32 < (ulong)((long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          pCVar26 = local_e8;
          pCVar40 = local_f0;
          auVar156._8_8_ = 0;
          auVar156._0_8_ = dVar39;
          auVar145._8_8_ = 0;
          auVar145._0_8_ = local_288._0_8_;
          auVar171._8_8_ = 0;
          auVar171._0_8_ = local_270[0];
          auVar204._8_8_ = 0;
          auVar204._0_8_ = local_2e8 * local_2f0 * dVar39;
          auVar45 = vfmsub231sd_fma(auVar204,auVar171,auVar145);
          auVar185._8_8_ = 0;
          auVar185._0_8_ = local_278;
          auVar111._8_8_ = 0;
          auVar111._0_8_ = local_2e8 * local_2e0;
          auVar45 = vfnmadd231sd_fma(auVar45,auVar185,auVar111);
          auVar193._8_8_ = 0;
          auVar193._0_8_ = dVar55;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = local_2e8 * local_2d0;
          auVar50 = vfnmadd231sd_fma(auVar45,auVar193,auVar80);
          auVar125._8_8_ = 0;
          auVar125._0_8_ = local_2e8 * local_2f0;
          auVar212._8_8_ = 0;
          auVar212._0_8_ = (double)local_288._0_8_ * dVar39;
          auVar45 = vfmadd231sd_fma(auVar212,auVar171,auVar125);
          auVar45 = vfnmadd231sd_fma(auVar45,auVar193,auVar111);
          auVar45 = vfmadd231sd_fma(auVar45,auVar185,auVar80);
          auVar112._8_8_ = 0;
          auVar112._0_8_ = local_2e8 * local_2e0;
          auVar222._8_8_ = 0;
          auVar222._0_8_ = (double)local_288._0_8_ * local_278;
          auVar46 = vfmadd231sd_fma(auVar222,auVar171,auVar112);
          auVar46 = vfmadd231sd_fma(auVar46,auVar193,auVar125);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = local_2e8 * local_2d0;
          auVar47 = vfnmadd231sd_fma(auVar46,auVar156,auVar81);
          auVar194._8_8_ = 0;
          auVar194._0_8_ = (double)local_288._0_8_ * dVar55;
          auVar46 = vfmadd231sd_fma(auVar194,auVar171,auVar81);
          auVar46 = vfnmadd231sd_fma(auVar46,auVar185,auVar125);
          auVar46 = vfmadd231sd_fma(auVar46,auVar156,auVar112);
          dVar54 = auVar50._0_8_ * auVar50._0_8_;
          dVar56 = auVar45._0_8_;
          dVar57 = auVar47._0_8_;
          local_270[0] = auVar46._0_8_;
          auVar20._8_8_ = 0x8000000000000000;
          auVar20._0_8_ = 0x8000000000000000;
          auVar47 = vxorpd_avx512vl(auVar50,auVar20);
          dVar206 = auVar47._0_8_;
          dVar53 = dVar56 * dVar57;
          auVar49 = vmulsd_avx512f(auVar45,auVar46);
          local_278 = dVar57 * local_270[0];
          auVar51 = ZEXT816(0xbff0000000000000);
          auVar196 = ZEXT816(0x4000000000000000);
          auVar247._8_8_ = 0;
          auVar247._0_8_ = dVar54 + dVar56 * dVar56;
          auVar45 = vfmadd213sd_fma(auVar247,auVar196,auVar51);
          dVar39 = dVar53 - local_270[0] * dVar206;
          auVar195._8_8_ = 0;
          auVar195._0_8_ = local_238.m_data[0];
          auVar113._8_8_ = 0;
          auVar113._0_8_ = local_238.m_data[1] * (dVar39 + dVar39);
          auVar46 = vfmadd231sd_fma(auVar113,auVar45,auVar195);
          auVar186._8_8_ = 0;
          auVar186._0_8_ = dVar57 * dVar206;
          auVar47 = vaddsd_avx512f(auVar186,auVar49);
          auVar223._8_8_ = 0;
          auVar223._0_8_ = local_238.m_data[2];
          auVar213._8_8_ = 0;
          auVar213._0_8_ = auVar47._0_8_ + auVar47._0_8_;
          auVar46 = vfmadd213sd_fma(auVar213,auVar223,auVar46);
          dVar39 = dVar53 + local_270[0] * dVar206;
          auVar254._8_8_ = 0;
          auVar254._0_8_ = dVar54 + dVar57 * dVar57;
          auVar47 = vfmadd213sd_fma(auVar254,auVar196,auVar51);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = dVar39 + dVar39;
          auVar126._8_8_ = 0;
          auVar126._0_8_ = auVar47._0_8_ * local_238.m_data[1];
          auVar48 = vfmadd231sd_fma(auVar126,auVar195,auVar114);
          dVar39 = local_278 - dVar56 * dVar206;
          auVar115._8_8_ = 0;
          auVar115._0_8_ = dVar39 + dVar39;
          auVar48 = vfmadd213sd_fma(auVar115,auVar223,auVar48);
          vmovsd_avx512f(auVar49);
          auVar49 = vsubsd_avx512f(auVar49,auVar186);
          dVar39 = local_278 + dVar56 * dVar206;
          auVar127._8_8_ = 0;
          auVar127._0_8_ = auVar49._0_8_ + auVar49._0_8_;
          auVar157._8_8_ = 0;
          auVar157._0_8_ = local_238.m_data[1] * (dVar39 + dVar39);
          auVar159 = vfmadd231sd_fma(auVar157,auVar195,auVar127);
          auVar82._8_8_ = 0;
          auVar82._0_8_ = dVar54 + local_270[0] * local_270[0];
          auVar49 = vfmadd213sd_fma(auVar82,auVar196,auVar51);
          auVar159 = vfmadd231sd_fma(auVar159,auVar49,auVar223);
          local_238.m_data[1] = (double)auVar48._0_8_;
          local_238.m_data[0] = (double)auVar46._0_8_;
          local_238.m_data[2] = auVar159._0_8_;
          peVar10 = (this->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          peVar14 = (peVar10->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          p_Var12 = (peVar10->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
            }
          }
          auVar248._0_8_ = auVar45._0_8_;
          local_288 = auVar50;
          (*peVar14->_vptr_ChInertiaCosserat[5])(peVar14,&local_188,&local_258,&local_238);
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          }
          auVar248._8_8_ = 0;
          auVar259._8_8_ = 0;
          auVar259._0_8_ = auVar49._0_8_;
          if ((this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            if ((long)local_2a8._8_8_ < 1) {
LAB_006a1962:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                           );
            }
            dVar206 = local_118 * local_110 * local_130;
            dVar147 = dVar53 - (double)local_288._0_8_ * local_270[0];
            dVar39 = dVar55 + (double)local_288._0_8_ * dVar57;
            dVar53 = dVar53 + (double)local_288._0_8_ * local_270[0];
            dVar44 = local_278 - (double)local_288._0_8_ * dVar56;
            dVar55 = dVar55 - (double)local_288._0_8_ * dVar57;
            dVar54 = (double)local_288._0_8_ * dVar56 + local_278;
            pdVar15 = (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            lVar41 = (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows + -3;
            psVar16 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            psVar17 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar37 = pdVar15 + 3;
            uVar32 = 0;
            pdVar38 = pdVar15;
            do {
              if (local_298 <= (long)uVar32) goto LAB_006a1962;
              dVar56 = dVar206 * *(double *)(local_2a8._0_8_ + uVar32 * 8);
              auVar205._8_8_ = 0;
              auVar205._0_8_ = local_188.m_data[0];
              auVar224._8_8_ = 0;
              auVar224._0_8_ = local_188.m_data[1] * (dVar147 + dVar147);
              auVar45 = vfmadd231sd_fma(auVar224,auVar248,auVar205);
              auVar232._8_8_ = 0;
              auVar232._0_8_ = local_188.m_data[2];
              auVar128._8_8_ = 0;
              auVar128._0_8_ = dVar39 + dVar39;
              auVar45 = vfmadd231sd_fma(auVar45,auVar128,auVar232);
              auVar146._8_8_ = 0;
              auVar146._0_8_ = dVar53 + dVar53;
              auVar239._8_8_ = 0;
              auVar239._0_8_ = auVar47._0_8_ * local_188.m_data[1];
              auVar46 = vfmadd231sd_fma(auVar239,auVar146,auVar205);
              auVar158._8_8_ = 0;
              auVar158._0_8_ = dVar44 + dVar44;
              auVar46 = vfmadd231sd_fma(auVar46,auVar158,auVar232);
              auVar172._8_8_ = 0;
              auVar172._0_8_ = dVar55 + dVar55;
              auVar214._8_8_ = 0;
              auVar214._0_8_ = local_188.m_data[1] * (dVar54 + dVar54);
              auVar48 = vfmadd231sd_fma(auVar214,auVar172,auVar205);
              auVar48 = vfmadd231sd_fma(auVar48,auVar259,auVar232);
              local_1e0 = auVar45._0_8_;
              local_1d8 = auVar46._0_8_;
              local_1d0 = auVar48._0_8_;
              if (lVar41 < (long)(uVar32 * 6)) goto LAB_006a1981;
              uVar35 = 3;
              if ((((ulong)(pdVar15 + uVar32 * 6) & 7) == 0) &&
                 (uVar35 = (ulong)(-((uint)((ulong)(pdVar15 + uVar32 * 6) >> 3) & 0x1fffffff) & 7),
                 2 < uVar35)) {
                uVar35 = 3;
              }
              if (uVar35 != 0) {
                uVar36 = 0;
                do {
                  pdVar38[uVar36] = pdVar38[uVar36] - dVar56 * (double)(&local_1e0)[uVar36];
                  uVar36 = uVar36 + 1;
                } while (uVar35 != uVar36);
              }
              if (uVar35 < 3) {
                do {
                  pdVar38[uVar35] = pdVar38[uVar35] - dVar56 * (double)(&local_1e0)[uVar35];
                  uVar35 = uVar35 + 1;
                } while (uVar35 != 3);
              }
              if (lVar41 < (long)(uVar32 * 6 + 3)) goto LAB_006a1981;
              uVar35 = 3;
              if ((((ulong)(pdVar15 + uVar32 * 6 + 3) & 7) == 0) &&
                 (uVar35 = (ulong)(-((uint)((ulong)(pdVar15 + uVar32 * 6 + 3) >> 3) & 0x1fffffff) &
                                  7), 2 < uVar35)) {
                uVar35 = 3;
              }
              dVar56 = dVar206 * *(double *)(local_2a8._0_8_ + uVar32 * 8);
              if (uVar35 != 0) {
                uVar36 = 0;
                do {
                  pdVar37[uVar36] = pdVar37[uVar36] - dVar56 * local_258.m_data[uVar36];
                  uVar36 = uVar36 + 1;
                } while (uVar35 != uVar36);
              }
              if (uVar35 < 3) {
                do {
                  pdVar37[uVar35] = pdVar37[uVar35] - dVar56 * local_258.m_data[uVar35];
                  uVar35 = uVar35 + 1;
                } while (uVar35 != 3);
              }
              uVar32 = uVar32 + 1;
              pdVar38 = pdVar38 + 6;
              pdVar37 = pdVar37 + 6;
            } while (uVar32 < (ulong)((long)psVar16 - (long)psVar17 >> 4));
          }
          if ((double *)local_2a8._0_8_ != (double *)0x0) {
            free(*(void **)(local_2a8._0_8_ + -8));
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < this->int_order_b);
      }
    }
  }
  return;
}

Assistant:

void ChElementBeamIGA::ComputeInternalForces_impl(ChVectorDynamic<>& Fi,
                                                  ChState& state_x,
                                                  ChStateDelta& state_w,
                                                  bool used_for_differentiation) {
    // get two values of absyssa at extreme of span
    double u1 = knots(order);
    double u2 = knots(knots.size() - order - 1);

    double c1 = (u2 - u1) / 2;
    double c2 = (u2 + u1) / 2;

    // zero the Fi accumulator
    Fi.setZero();

    // Do quadrature over the "s" shear Gauss points
    // (only if int_order_b != int_order_s, otherwise do a single loop later over "b" bend points also for shear)

    //***TODO*** maybe not needed: separate bending and shear integration points.

    // Do quadrature over the "b" bend Gauss points

    for (int ig = 0; ig < int_order_b; ++ig) {
        // absyssa in typical -1,+1 range:
        double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
        // absyssa in span range:
        double u = (c1 * eta + c2);
        // scaling = gauss weight
        double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

        // Jacobian Jsu = ds/du
        double Jsu = this->Jacobian_b[ig];
        // Jacobian Jue = du/deta
        double Jue = c1;

        // compute the basis functions N(u) at given u:
        int nspan = order;

        ChMatrixDynamic<> N(2, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du

        geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                          N);  ///< here return N and dN/du

        // interpolate rotation of section at given u, to compute R.
        // Note: this is approximate.
        // A more precise method: use quaternion splines, as in Kim,Kim and Shin, 1995 paper.
        ChQuaternion<> q_delta;
        ChVector<> da = VNULL;
        ChVector<> delta_rot_dir;
        double delta_rot_angle;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
            q_delta.Q_to_AngAxis(delta_rot_angle,
                                 delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
            da += delta_rot_dir * delta_rot_angle * N(0, i);  // a = N_i*a_i
        }
        ChQuaternion<> qda;
        qda.Q_from_Rotv(da);
        ChQuaternion<> qR = nodes[0]->coord.rot * qda;

        // compute the 3x3 rotation matrix R equivalent to quaternion above
        ChMatrix33<> R(qR);

        // compute abs. spline gradient r'  = dr/ds
        ChVector<> dr;
        for (int i = 0; i < nodes.size(); ++i) {
            ChVector<> r_i(state_x.segment(i * 7, 3));
            dr += r_i * N(1, i);  // dr/du = N_i'*r_i
        }
        // (note r'= dr/ds = dr/du du/ds = dr/du * 1/Jsu   where Jsu computed in SetupInitial)
        dr *= 1.0 / Jsu;

        // compute abs. time rate of spline gradient  dr'/dt
        ChVector<> drdt;
        for (int i = 0; i < nodes.size(); ++i) {
            ChVector<> drdt_i(state_w.segment(i * 6, 3));
            drdt += drdt_i * N(1, i);
        }
        drdt *= 1.0 / Jsu;

        // compute abs spline rotation gradient q' = dq/ds
        // But.. easier to compute local gradient of spin vector a' = da/ds
        da = VNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            q_delta = qR.GetConjugate() * q_i;
            q_delta.Q_to_AngAxis(delta_rot_angle,
                                 delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
            da += delta_rot_dir * delta_rot_angle * N(1, i);  // da/du = N_i'*a_i
        }
        // (note a= da/ds = da/du du/ds = da/du * 1/Jsu   where Jsu computed in SetupInitial)
        da *= 1.0 / Jsu;

        // compute abs rate of spline rotation gradient da'/dt
        ChVector<> dadt;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            ChVector<> wl_i(state_w.segment(i * 6 + 3, 3));  //  w in node csys
            ChVector<> w_i = q_i.Rotate(wl_i);               // w in absolute csys
            dadt += w_i * N(1, i);
        }
        dadt *= 1.0 / Jsu;

        // compute local epsilon strain:  strain_e= R^t * r' - {1, 0, 0}
        ChVector<> astrain_e = R.transpose() * dr - VECT_X - this->strain_e_0[ig];

        // compute local time rate of strain:  strain_e_dt = R^t * dr'/dt
        ChVector<> astrain_e_dt = R.transpose() * drdt;

        // compute local curvature strain:  strain_k= 2*[F(q*)(+)] * q' = 2*[F(q*)(+)] * N_i'*q_i = R^t * a' = a'_local
        ChVector<> astrain_k = da - this->strain_k_0[ig];

        // compute local time rate of curvature strain:
        ChVector<> astrain_k_dt = R.transpose() * dadt;

        // compute stress n  (local cut forces)
        // compute stress_m  (local cut torque)
        ChVector<> astress_n;
        ChVector<> astress_m;
        ChBeamMaterialInternalData* aplastic_data_old = nullptr;
        ChBeamMaterialInternalData* aplastic_data = nullptr;
        std::vector<std::unique_ptr<ChBeamMaterialInternalData>> foo_plastic_data;
        if (this->section->GetPlasticity()) {
            aplastic_data_old = this->plastic_data_old[ig].get();
            aplastic_data = this->plastic_data[ig].get();
            if (used_for_differentiation) {
                // Avoid updating plastic_data_new if ComputeInternalForces_impl() called for computing
                // stiffness matrix by backward differentiation. Otherwise pollutes the plastic_data integration.
                this->section->GetPlasticity()->CreatePlasticityData(1, foo_plastic_data);
                aplastic_data = foo_plastic_data[0].get();
            }
        }
        this->section->ComputeStress(astress_n, astress_m, astrain_e, astrain_k, aplastic_data, aplastic_data_old);

        if (!used_for_differentiation) {
            this->stress_n[ig] = astress_n;
            this->stress_m[ig] = astress_m;
            this->strain_e[ig] = astrain_e;
            this->strain_k[ig] = astrain_k;
        }

        // add viscous damping
        if (this->section->GetDamping()) {
            ChVector<> n_sp;
            ChVector<> m_sp;
            this->section->GetDamping()->ComputeStress(n_sp, m_sp, astrain_e_dt, astrain_k_dt);
            astress_n += n_sp;
            astress_m += m_sp;
        }

        // compute internal force, in generalized coordinates:

        ChVector<> stress_n_abs = R * astress_n;
        ChVector<> stress_m_abs = R * astress_m;

        for (int i = 0; i < nodes.size(); ++i) {
            // -Force_i = w * Jue * Jsu * Jsu^-1 * N' * R * C * (strain_e - strain_e0)
            //          = w * Jue                * N'         * stress_n_abs
            ChVector<> Force_i = stress_n_abs * N(1, i) * (-w * Jue);
            Fi.segment(i * 6, 3) += Force_i.eigen();

            // -Torque_i =   w * Jue * Jsu * Jsu^-1 * R_i^t * N'               * R * D * (strain_k - strain_k0) +
            //             + w * Jue * Jsu *          R_i^t * N * skew(r')^t   * R * C * (strain_e - strain_e0)
            //           =   w * Jue * R_i^t                * N'               * stress_m_abs +
            //             + w * Jue * Jsu * R_i^t          * N * skew(r')^t   * stress_n_abs
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            ChVector<> Torque_i = q_i.RotateBack(stress_m_abs * N(1, i) * (-w * Jue) -
                                                 Vcross(dr, stress_n_abs) * N(0, i) * (-w * Jue * Jsu));
            Fi.segment(3 + i * 6, 3) += Torque_i.eigen();
        }

        // GetLog() << "     gp n." << ig <<   "  J=" << this->Jacobian[ig] << "   strain_e= " << strain_e << "\n";
        // GetLog() << "                    stress_n= " << stress_n << "\n";
    }

    // Add also inertial quadratic terms: gyroscopic and centrifugal

    if (ChElementBeamIGA::add_gyroscopic_terms == true) {
        if (ChElementBeamIGA::lumped_mass == true) {
            // CASE OF LUMPED MASS - faster
            double node_multiplier = length / (double)nodes.size();
            ChVector<> mFcent_i;
            ChVector<> mTgyro_i;
            for (int i = 0; i < nodes.size(); ++i) {
                this->section->GetInertia()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, state_w.segment(3 + i * 6, 3));
                ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                Fi.segment(i * 6, 3) -= node_multiplier * q_i.Rotate(mFcent_i).eigen();
                Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
            }
        } else {
            // CASE OF CONSISTENT MASS
            ChVector<> mFcent_i;
            ChVector<> mTgyro_i;
            // evaluate inertial quadratic forces using same gauss points used for bending
            for (int ig = 0; ig < int_order_b; ++ig) {
                double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
                double u = (c1 * eta + c2);
                double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

                double Jsu = this->Jacobian_b[ig];
                double Jue = c1;
                int nspan = order;

                ChMatrixDynamic<> N(1, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du
                geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                                  N);  ///< here return N and dN/du

                // interpolate rotation of section at given u, to compute R.
                // Note: this is approximate.
                // A more precise method: use quaternion splines, as in Kim,Kim and Shin, 1995 paper.
                ChQuaternion<> q_delta;
                ChVector<> da = VNULL;
                ChVector<> delta_rot_dir;
                double delta_rot_angle;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
                    q_delta.Q_to_AngAxis(delta_rot_angle,
                                         delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
                    da += delta_rot_dir * delta_rot_angle * N(0, i);  // a = N_i*a_i
                }
                ChQuaternion<> qda;
                qda.Q_from_Rotv(da);
                ChQuaternion<> qR = nodes[0]->coord.rot * qda;

                ChVector<> w_sect;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    ChVector<> wl_i(state_w.segment(i * 6 + 3, 3));  //  w in node csys
                    ChVector<> w_i = q_i.Rotate(wl_i);               // w in absolute csys
                    w_sect += w_i * N(0, i);
                }
                w_sect = qR.RotateBack(w_sect);  // w in sectional csys

                this->section->GetInertia()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, w_sect);

                for (int i = 0; i < nodes.size(); ++i) {
                    Fi.segment(i * 6, 3) -= w * Jsu * Jue * N(0, i) * qR.Rotate(mFcent_i).eigen();
                    Fi.segment(3 + i * 6, 3) -= w * Jsu * Jue * N(0, i) * mTgyro_i.eigen();
                }
            }
        }
    }  // end quadratic inertial force terms
}